

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

void ecs_run_component_trigger
               (ecs_world_t *world,ecs_vector_t *trigger_vec,ecs_entity_t component,
               ecs_table_t *table,ecs_data_t *data,int32_t row,int32_t count)

{
  ecs_table_t *peVar1;
  int32_t iVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  ecs_column_t *peVar6;
  long lVar7;
  int32_t columns [1];
  ecs_type_t types [1];
  ecs_entity_t components [1];
  ecs_iter_table_t table_data;
  int local_174;
  void *local_170;
  ecs_table_t *local_168;
  uint local_15c;
  ulong local_158;
  ecs_type_t local_150;
  ecs_entity_t local_148;
  int *local_140;
  ecs_table_t *local_138;
  undefined8 local_130;
  ecs_entity_t *local_128;
  ecs_type_t *local_120;
  undefined8 local_118;
  ecs_world_t *local_110;
  undefined1 local_108 [8];
  undefined8 local_100;
  int **local_f0;
  undefined8 local_e0;
  undefined4 local_d8;
  ecs_column_t *local_d0;
  long local_c8;
  undefined8 local_c0;
  undefined4 local_a8;
  int32_t local_a4;
  
  _ecs_assert((_Bool)(world->in_progress ^ 1),0xc,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x111);
  if (world->in_progress == true) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x111,
                  "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                 );
  }
  if ((table->flags & 2) == 0) {
    local_168 = table;
    pvVar4 = _ecs_vector_first(data->entities,8,0x10);
    _ecs_assert(pvVar4 != (void *)0x0,0xc,(char *)0x0,"entities != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x118);
    if (pvVar4 == (void *)0x0) {
      __assert_fail("entities != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x118,
                    "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                   );
    }
    local_170 = pvVar4;
    iVar2 = ecs_vector_count(data->entities);
    _ecs_assert(row < iVar2,0xc,(char *)0x0,"row < ecs_vector_count(data->entities)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x119);
    iVar2 = ecs_vector_count(data->entities);
    if (iVar2 <= row) {
      __assert_fail("row < ecs_vector_count(data->entities)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x119,
                    "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                   );
    }
    iVar2 = ecs_vector_count(data->entities);
    _ecs_assert(count + row <= iVar2,0xc,(char *)0x0,
                "(row + count) <= ecs_vector_count(data->entities)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x11a);
    iVar2 = ecs_vector_count(data->entities);
    if (iVar2 < count + row) {
      __assert_fail("(row + count) <= ecs_vector_count(data->entities)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x11a,
                    "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                   );
    }
    local_15c = ecs_vector_count(trigger_vec);
    peVar1 = local_168;
    if (local_15c != 0) {
      pvVar4 = _ecs_vector_first(trigger_vec,0x28,0x10);
      uVar3 = ecs_type_index_of(peVar1->type,component);
      _ecs_assert(-1 < (int)uVar3,0xc,(char *)0x0,"index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0xdb);
      if ((int)uVar3 < 0) {
        __assert_fail("index >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0xdb,
                      "void run_component_trigger_for_entities(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entity_t *)"
                     );
      }
      local_170 = (void *)((long)local_170 + (long)(row * 8));
      local_158 = (ulong)(uint)row;
      local_148 = component;
      local_150 = ecs_type_from_entity(world,component);
      local_c8 = (long)local_170;
      if ((int)uVar3 < local_168->column_count) {
        peVar6 = data->columns;
        local_174 = uVar3 + 1;
        if (peVar6[uVar3].size == 0) {
          local_174 = 0;
        }
      }
      else {
        local_174 = 0;
        peVar6 = data->columns;
      }
      local_140 = &local_174;
      local_138 = local_168;
      local_130 = 0;
      local_128 = &local_148;
      local_120 = &local_150;
      local_118 = 0;
      memset(local_108,0,0xd8);
      local_e0 = 0x100000001;
      local_d8 = 1;
      local_a8 = (undefined4)local_158;
      local_a4 = count;
      if (0 < (int)local_15c) {
        uVar5 = (ulong)local_15c;
        lVar7 = 0;
        local_110 = world;
        local_f0 = &local_140;
        local_d0 = peVar6;
        do {
          local_100 = *(undefined8 *)((long)pvVar4 + lVar7 + 0x18);
          local_c0 = *(undefined8 *)((long)pvVar4 + lVar7 + 0x20);
          (**(code **)((long)pvVar4 + lVar7 + 8))(&local_110);
          lVar7 = lVar7 + 0x28;
        } while (uVar5 * 0x28 != lVar7);
      }
    }
  }
  return;
}

Assistant:

static
void ecs_run_component_trigger(
    ecs_world_t * world,
    ecs_vector_t * trigger_vec,
    ecs_entity_t component,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count)
{
    ecs_assert(!world->in_progress, ECS_INTERNAL_ERROR, NULL);

    if (table->flags & EcsTableIsPrefab) {
        return;
    }

    ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);        
    ecs_assert(entities != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(row < ecs_vector_count(data->entities), ECS_INTERNAL_ERROR, NULL);
    ecs_assert((row + count) <= ecs_vector_count(data->entities), ECS_INTERNAL_ERROR, NULL);

    entities = ECS_OFFSET(entities, ECS_SIZEOF(ecs_entity_t) * row);

    run_component_trigger_for_entities(
        world, trigger_vec, component, table, data, row, count, entities);
}